

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQInteger sqstd_fseek(SQFILE file,SQInteger offset,SQInteger origin)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  FILE *in_RDI;
  SQInteger realorigin;
  int local_28;
  
  if (in_RDX == 0) {
    local_28 = 1;
  }
  else if (in_RDX == 1) {
    local_28 = 2;
  }
  else {
    if (in_RDX != 2) {
      return -1;
    }
    local_28 = 0;
  }
  iVar1 = fseek(in_RDI,in_RSI,local_28);
  return (long)iVar1;
}

Assistant:

SQInteger sqstd_fseek(SQFILE file, SQInteger offset, SQInteger origin)
{
    SQInteger realorigin;
    switch(origin) {
        case SQ_SEEK_CUR: realorigin = SEEK_CUR; break;
        case SQ_SEEK_END: realorigin = SEEK_END; break;
        case SQ_SEEK_SET: realorigin = SEEK_SET; break;
        default: return -1; //failed
    }
    return fseek((FILE *)file,(long)offset,(int)realorigin);
}